

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
clipp::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,man_page *man)

{
  pointer psVar1;
  bool bVar2;
  ostream *poVar3;
  string *psVar4;
  doc_string secSpc;
  
  secSpc._M_dataplus._M_p = (pointer)&secSpc.field_2;
  std::__cxx11::string::_M_construct((ulong)&secSpc,(char)man->sectionSpc_ + '\x01');
  psVar1 = (man->sections_).
           super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar2 = true;
  for (psVar4 = (string *)
                &((man->sections_).
                  super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>
                  ._M_impl.super__Vector_impl_data._M_start)->content_;
      (pointer)(psVar4 + -0x20) != psVar1; psVar4 = psVar4 + 0x40) {
    if (*(long *)(psVar4 + 8) != 0) {
      if (!bVar2) {
        std::operator<<((ostream *)os,(string *)&secSpc);
      }
      if (*(long *)(psVar4 + -0x18) != 0) {
        poVar3 = std::operator<<((ostream *)os,psVar4 + -0x20);
        std::operator<<(poVar3,'\n');
      }
      std::operator<<((ostream *)os,psVar4);
      bVar2 = false;
    }
  }
  std::operator<<((ostream *)os,'\n');
  std::__cxx11::string::~string((string *)&secSpc);
  return os;
}

Assistant:

OStream&
operator << (OStream& os, const man_page& man)
{
    bool first = true;
    const auto secSpc = doc_string(man.section_row_spacing() + 1, '\n');
    for(const auto& section : man) {
        if(!section.content().empty()) {
            if(first) first = false; else os << secSpc;
            if(!section.title().empty()) os << section.title() << '\n';
            os << section.content();
        }
    }
    os << '\n';
    return os;
}